

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::IfNonePathDeclarationSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,IfNonePathDeclarationSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  if (this == (IfNonePathDeclarationSyntax *)0x2) {
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[6].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  }
  else {
    if (this == (IfNonePathDeclarationSyntax *)0x1) {
      return __return_storage_ptr__ + 5;
    }
    if (this != (IfNonePathDeclarationSyntax *)0x0) {
      return (PtrTokenOrSyntax *)0x0;
    }
    pPVar1 = __return_storage_ptr__ + 2;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax IfNonePathDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &keyword;
        case 2: return path.get();
        default: return nullptr;
    }
}